

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O2

void ipc_connect_cb(uv_connect_t *req,int status)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (status == 0) {
    iVar1 = uv_read_start((uv_stream_t *)&req[1].type,ipc_alloc_cb,ipc_read_cb);
    if (iVar1 == 0) {
      return;
    }
    pcVar3 = "0 == uv_read_start((uv_stream_t*) &ctx->ipc_pipe, ipc_alloc_cb, ipc_read_cb)";
    uVar2 = 0x9f;
  }
  else {
    pcVar3 = "0 == status";
    uVar2 = 0x9c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void ipc_connect_cb(uv_connect_t* req, int status) {
  struct ipc_client_ctx* ctx;
  ctx = container_of(req, struct ipc_client_ctx, connect_req);
  ASSERT(0 == status);
  ASSERT(0 == uv_read_start((uv_stream_t*) &ctx->ipc_pipe,
                            ipc_alloc_cb,
                            ipc_read_cb));
}